

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawTriangleStrip(Vector2 *points,int pointsCount,Color color)

{
  int local_20;
  int i;
  int pointsCount_local;
  Vector2 *points_local;
  Color color_local;
  
  if (2 < pointsCount) {
    rlCheckRenderBatchLimit((pointsCount + -2) * 3);
    rlBegin(4);
    points_local._4_1_ = color.r;
    points_local._5_1_ = color.g;
    points_local._6_1_ = color.b;
    points_local._7_1_ = color.a;
    rlColor4ub(points_local._4_1_,points_local._5_1_,points_local._6_1_,points_local._7_1_);
    for (local_20 = 2; local_20 < pointsCount; local_20 = local_20 + 1) {
      if (local_20 % 2 == 0) {
        rlVertex2f(points[local_20].x,points[local_20].y);
        rlVertex2f(points[local_20 + -2].x,points[local_20 + -2].y);
        rlVertex2f(points[local_20 + -1].x,points[local_20 + -1].y);
      }
      else {
        rlVertex2f(points[local_20].x,points[local_20].y);
        rlVertex2f(points[local_20 + -1].x,points[local_20 + -1].y);
        rlVertex2f(points[local_20 + -2].x,points[local_20 + -2].y);
      }
    }
    rlEnd();
  }
  return;
}

Assistant:

void DrawTriangleStrip(Vector2 *points, int pointsCount, Color color)
{
    if (pointsCount >= 3)
    {
        rlCheckRenderBatchLimit(3*(pointsCount - 2));

        rlBegin(RL_TRIANGLES);
            rlColor4ub(color.r, color.g, color.b, color.a);

            for (int i = 2; i < pointsCount; i++)
            {
                if ((i%2) == 0)
                {
                    rlVertex2f(points[i].x, points[i].y);
                    rlVertex2f(points[i - 2].x, points[i - 2].y);
                    rlVertex2f(points[i - 1].x, points[i - 1].y);
                }
                else
                {
                    rlVertex2f(points[i].x, points[i].y);
                    rlVertex2f(points[i - 1].x, points[i - 1].y);
                    rlVertex2f(points[i - 2].x, points[i - 2].y);
                }
            }
        rlEnd();
    }
}